

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

char * helicsPublicationGetTag(HelicsPublication pub,char *tagname)

{
  Interface *this;
  HelicsPublication pvVar1;
  size_t sVar2;
  string *psVar3;
  _Alloc_hider _Var4;
  string_view tag;
  
  pvVar1 = (HelicsPublication)0x0;
  if ((pub != (HelicsPublication)0x0) && (*pub == -0x684eff5b)) {
    pvVar1 = pub;
  }
  if (pvVar1 == (HelicsPublication)0x0) {
    psVar3 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    this = *(Interface **)((long)pvVar1 + 0x18);
    _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    if (tagname != (char *)0x0) {
      sVar2 = strlen(tagname);
      _Var4._M_p = tagname;
    }
    tag._M_str = _Var4._M_p;
    tag._M_len = sVar2;
    psVar3 = helics::Interface::getTag_abi_cxx11_(this,tag);
  }
  return (psVar3->_M_dataplus)._M_p;
}

Assistant:

const char* helicsPublicationGetTag(HelicsPublication pub, const char* tagname)
{
    auto* pubObj = verifyPublication(pub, nullptr);
    if (pubObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = pubObj->pubPtr->getTag(AS_STRING_VIEW(tagname));
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}